

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O0

void __thiscall
OpenMD::RhoR::RhoR(RhoR *this,SimInfo *info,string *filename,string *sele,RealType len,int nrbins,
                  RealType particleR)

{
  undefined1 uVar1;
  string *in_RCX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  SimInfo *in_stack_00000018;
  SelectionEvaluator *in_stack_00000020;
  SimInfo *in_stack_000001c8;
  SelectionManager *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  StaticAnalyser *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  StaticAnalyser *in_stack_ffffffffffffff30;
  SelectionManager *this_00;
  undefined8 *__new_size;
  vector<double,_std::allocator<double>_> *this_01;
  SelectionEvaluator *this_02;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  SelectionEvaluator *in_stack_ffffffffffffff70;
  string local_80 [72];
  undefined8 local_38;
  undefined8 local_28;
  string *local_20;
  
  local_38 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff30,
             (SimInfo *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  *in_RDI = &PTR__RhoR_0055fe00;
  this_02 = (SelectionEvaluator *)(in_RDI + 0x1b);
  std::__cxx11::string::string((string *)this_02,local_20);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xc9);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  in_RDI[0xe2] = local_28;
  this_00 = (SelectionManager *)(in_RDI + 0xe6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a188b);
  __new_size = in_RDI + 0xe9;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1a18a1);
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_ffffffffffffff20 = (StaticAnalyser *)(in_RDI + 0xc9);
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
    SelectionSet::~SelectionSet((SelectionSet *)0x1a192b);
  }
  in_RDI[0xe4] = (double)in_RDI[0xe2] / (double)*(uint *)((long)in_RDI + 0x34);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_01,(size_type)__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
  in_RDI[0xe5] = local_38;
  getPrefix((string *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff28),(char *)in_stack_ffffffffffffff20);
  StaticAnalyser::setOutputName
            (in_stack_ffffffffffffff20,
             (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

RhoR::RhoR(SimInfo* info, const std::string& filename,
             const std::string& sele, RealType len, int nrbins,
             RealType particleR) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), len_(len) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    deltaR_ = len_ / nBins_;

    histogram_.resize(nBins_);
    avgRhoR_.resize(nBins_);
    particleR_ = particleR;
    setOutputName(getPrefix(filename) + ".RhoR");
  }